

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O1

void KRuntime_raise(KonohaContext *kctx,int symbol,int fault,kString *optionalErrorInfo,
                   KonohaStack *top)

{
  KRuntimeContextVar *pKVar1;
  kObject_conflict *pkVar2;
  
  if (symbol != 0) {
    pKVar1 = kctx->stack;
    if (pKVar1->evaljmpbuf != (jmp_buf *)0x0) {
      pkVar2 = (*kctx->klib->new_kObject)
                         (kctx,(kArray *)0x0,
                          *(KClass **)((kctx->share->classTable).field_1.bytebuf + 0x50),
                          (uintptr_t)optionalErrorInfo);
      *(int *)&pkVar2->field_1 = symbol;
      *(int *)((long)&pkVar2->field_1 + 4) = fault;
      pKVar1->topStack = top;
      pKVar1->ThrownException = (kException *)pkVar2;
      (*kctx->platApi->longjmp_i)(*pKVar1->evaljmpbuf,symbol);
    }
    (*kctx->platApi->exit_i)
              (1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
               ,0x302);
    return;
  }
  __assert_fail("symbol != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/konoha-project[P]konoha3/src/konoha/import/klibexec.h"
                ,0x2f6,"void KRuntime_raise(KonohaContext *, int, int, kString *, KonohaStack *)");
}

Assistant:

static void KRuntime_raise(KonohaContext *kctx, int symbol, int fault, kString *optionalErrorInfo, KonohaStack *top)
{
	KRuntimeContextVar *runtime = kctx->stack;
	KNH_ASSERT(symbol != 0);
	if(runtime->evaljmpbuf != NULL) {
		kException *e = new_(Exception, optionalErrorInfo, NULL);
		e->symbol = symbol;
		e->fault  = fault;
		runtime->topStack = top;
		//runtime->faultInfo = fault;
		if(true/*optionalErrorInfo != NULL*/) {
			KUnsafeFieldSet(runtime->ThrownException, e);
		}
		PLATAPI longjmp_i(*runtime->evaljmpbuf, symbol);  // in setjmp 0 means good
	}
	KExit(EXIT_FAILURE);
}